

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

UVec4 __thiscall tcu::getTextureBorderColorUint(tcu *this,TextureFormat *format,Sampler *sampler)

{
  Channel ndx;
  uint uVar1;
  TextureSwizzle *pTVar2;
  uint *puVar3;
  deUint32 *pdVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar5;
  UVec4 UVar6;
  int local_54;
  Channel map;
  int c;
  UVec4 valueMax;
  IVec4 channelBits;
  Channel *channelMap;
  TextureChannelClass channelClass;
  Sampler *sampler_local;
  TextureFormat *format_local;
  UVec4 *result;
  
  getTextureChannelClass(format->type);
  pTVar2 = getBorderColorReadSwizzle(format->order);
  getChannelBitDepth((tcu *)(valueMax.m_data + 2),format->type);
  getNBitUnsignedIntegerVec4MaxValue((tcu *)&map,(IVec4 *)(valueMax.m_data + 2));
  Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)this);
  uVar5 = extraout_RDX;
  for (local_54 = 0; local_54 < 4; local_54 = local_54 + 1) {
    ndx = pTVar2->components[local_54];
    if (ndx == CHANNEL_ZERO) {
      puVar3 = Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)this,local_54);
      *puVar3 = 0;
      uVar5 = extraout_RDX_00;
    }
    else if (ndx == CHANNEL_ONE) {
      puVar3 = Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)this,local_54);
      *puVar3 = 1;
      uVar5 = extraout_RDX_01;
    }
    else {
      pdVar4 = rr::GenericVec4::getAccess<unsigned_int>(&sampler->borderColor);
      uVar1 = pdVar4[(int)ndx];
      puVar3 = Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)&map,ndx);
      uVar1 = de::min<unsigned_int>(uVar1,*puVar3);
      puVar3 = Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)this,local_54);
      *puVar3 = uVar1;
      uVar5 = extraout_RDX_02;
    }
  }
  UVar6.m_data[2] = (int)uVar5;
  UVar6.m_data[3] = (int)((ulong)uVar5 >> 0x20);
  UVar6.m_data._0_8_ = this;
  return (UVec4)UVar6.m_data;
}

Assistant:

static tcu::UVec4 getTextureBorderColorUint (const TextureFormat& format, const Sampler& sampler)
{
	const tcu::TextureChannelClass	channelClass	= getTextureChannelClass(format.type);
	const TextureSwizzle::Channel*	channelMap		= getBorderColorReadSwizzle(format.order).components;
	const IVec4						channelBits		= getChannelBitDepth(format.type);
	const UVec4						valueMax		= getNBitUnsignedIntegerVec4MaxValue(channelBits);
	UVec4							result;

	DE_ASSERT(channelClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER);
	DE_UNREF(channelClass);

	for (int c = 0; c < 4; c++)
	{
		const TextureSwizzle::Channel map = channelMap[c];
		if (map == TextureSwizzle::CHANNEL_ZERO)
			result[c] = 0;
		else if (map == TextureSwizzle::CHANNEL_ONE)
			result[c] = 1;
		else
		{
			// integer values are clamped to a representable range
			result[c] = de::min(sampler.borderColor.getAccess<deUint32>()[(int)map], valueMax[(int)map]);
		}
	}

	return result;
}